

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

Clifford * operator^(Clifford *__return_storage_ptr__,Clifford *A,Clifford *B)

{
  uint uVar1;
  uint uVar2;
  pointer pBVar3;
  pointer pBVar4;
  float *pfVar5;
  int iVar6;
  pointer pBVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pBVar10;
  long lVar11;
  float fVar12;
  Blade BStack_38;
  
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pfVar5 = Re;
  iVar6 = dim;
  uVar8 = 0;
  uVar9 = 0;
  if (0 < dim) {
    uVar9 = (ulong)(uint)dim;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    pfVar5[uVar8] = 0.0;
  }
  pBVar3 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pBVar7 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                super__Vector_impl_data._M_start; pfVar5 = Re, pBVar7 != pBVar3; pBVar7 = pBVar7 + 1
      ) {
    uVar1 = pBVar7->mBase;
    pBVar4 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    for (pBVar10 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                   super__Vector_impl_data._M_start; pBVar10 != pBVar4; pBVar10 = pBVar10 + 1) {
      uVar2 = pBVar10->mBase;
      if (((uVar2 & uVar1) == 0) && (fVar12 = pBVar7->mVal * pBVar10->mVal, 1e-06 < ABS(fVar12))) {
        pfVar5[(int)(uVar2 ^ uVar1)] =
             (float)signs[(int)uVar1][(int)uVar2] * fVar12 + pfVar5[(int)(uVar2 ^ uVar1)];
      }
    }
  }
  for (lVar11 = 0; lVar11 < iVar6; lVar11 = lVar11 + 1) {
    if (1e-06 < ABS(Re[lVar11])) {
      Blade::Blade(&BStack_38,(int)lVar11,Re[lVar11]);
      std::vector<Blade,_std::allocator<Blade>_>::emplace_back<Blade>
                (__return_storage_ptr__,&BStack_38);
      Blade::~Blade(&BStack_38);
      iVar6 = dim;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator^(Clifford A, Clifford B)
{
   Clifford R; 
   //double *Re=new double[dim];
   for(int i=0;i<dim;i++)Re[i]=0;


   idx a=A.begin();
	while(a!=A.end())
	{
		int am=a->mBase;
		idx b=B.begin();
		while(b!=B.end())
		{	
			int bm=b->mBase;
			
			if((am&bm)==0)
			{
				float prd=(a->mVal)*(b->mVal);
				if(fabs(prd)>Error2)
					Re[am^bm]+=signs[am][bm]*prd;

			}
			b++;
		}
		a++;
	}

	for(int i=0;i<dim;i++)
	{if(fabs(Re[i])>Error2){R.push_back(Blade(i,Re[i]));}}
  //delete Re;
  return R;
}